

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

void aec_get_rsi_lsb_32(aec_stream *strm)

{
  int iVar1;
  int rsi;
  aec_stream *strm_local;
  
  iVar1 = strm->rsi * strm->block_size;
  memcpy(strm->state->data_raw,strm->next_in,(long)(iVar1 * 4));
  strm->next_in = strm->next_in + iVar1 * 4;
  strm->avail_in = strm->avail_in - (long)(iVar1 * 4);
  return;
}

Assistant:

void aec_get_rsi_lsb_32(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = (uint32_t)in[4 * i]
            | ((uint32_t)in[4 * i + 1] << 8)
            | ((uint32_t)in[4 * i + 2] << 16)
            | ((uint32_t)in[4 * i + 3] << 24);

    strm->next_in += 4 * rsi;
    strm->avail_in -= 4 * rsi;
}